

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool flatbuffers::StringToIntegerImpl<unsigned_long>
               (unsigned_long *val,char *str,int base,bool check_errno)

{
  bool bVar1;
  int *piVar2;
  byte local_39;
  char *local_38;
  char *endptr;
  char *s;
  bool check_errno_local;
  char *pcStack_20;
  int base_local;
  char *str_local;
  unsigned_long *val_local;
  
  s._3_1_ = check_errno;
  s._4_4_ = base;
  pcStack_20 = str;
  str_local = (char *)val;
  if (str != (char *)0x0) {
    endptr = str;
    if (base < 1) {
      while( true ) {
        local_39 = 0;
        if (*endptr != '\0') {
          bVar1 = is_digit(*endptr);
          local_39 = bVar1 ^ 0xff;
        }
        if ((local_39 & 1) == 0) break;
        endptr = endptr + 1;
      }
      if ((*endptr == '0') && (bVar1 = is_alpha_char(endptr[1],'X'), bVar1)) {
        val_local._7_1_ =
             StringToIntegerImpl<unsigned_long>
                       ((unsigned_long *)str_local,pcStack_20,0x10,(bool)(s._3_1_ & 1));
      }
      else {
        val_local._7_1_ =
             StringToIntegerImpl<unsigned_long>
                       ((unsigned_long *)str_local,pcStack_20,10,(bool)(s._3_1_ & 1));
      }
    }
    else {
      if (check_errno) {
        piVar2 = __errno_location();
        *piVar2 = 0;
      }
      local_38 = pcStack_20;
      strtoval_impl((uint64_t *)str_local,pcStack_20,&local_38,s._4_4_);
      if ((*local_38 == '\0') && (local_38 != pcStack_20)) {
        if (((s._3_1_ & 1) == 0) || (piVar2 = __errno_location(), *piVar2 == 0)) {
          val_local._7_1_ = true;
        }
        else {
          val_local._7_1_ = false;
        }
      }
      else {
        str_local[0] = '\0';
        str_local[1] = '\0';
        str_local[2] = '\0';
        str_local[3] = '\0';
        str_local[4] = '\0';
        str_local[5] = '\0';
        str_local[6] = '\0';
        str_local[7] = '\0';
        val_local._7_1_ = false;
      }
    }
    return val_local._7_1_;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                ,0x11f,
                "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = unsigned long]"
               );
}

Assistant:

inline bool StringToIntegerImpl(T *val, const char *const str,
                                const int base = 0,
                                const bool check_errno = true) {
  // T is int64_t or uint64_T
  FLATBUFFERS_ASSERT(str);
  if (base <= 0) {
    auto s = str;
    while (*s && !is_digit(*s)) s++;
    if (s[0] == '0' && is_alpha_char(s[1], 'X'))
      return StringToIntegerImpl(val, str, 16, check_errno);
    // if a prefix not match, try base=10
    return StringToIntegerImpl(val, str, 10, check_errno);
  } else {
    if (check_errno) errno = 0;  // clear thread-local errno
    auto endptr = str;
    strtoval_impl(val, str, const_cast<char **>(&endptr), base);
    if ((*endptr != '\0') || (endptr == str)) {
      *val = 0;      // erase partial result
      return false;  // invalid string
    }
    // errno is out-of-range, return MAX/MIN
    if (check_errno && errno) return false;
    return true;
  }
}